

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_time_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_577d4e::X509TimeTest_TestCmpTimeCurrent_Test::
~X509TimeTest_TestCmpTimeCurrent_Test(X509TimeTest_TestCmpTimeCurrent_Test *this)

{
  X509TimeTest_TestCmpTimeCurrent_Test *this_local;
  
  ~X509TimeTest_TestCmpTimeCurrent_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(X509TimeTest, TestCmpTimeCurrent) {
  time_t now = time(NULL);
  // Pick a day earlier and later, relative to any system clock.
  bssl::UniquePtr<ASN1_TIME> asn1_before(ASN1_TIME_adj(NULL, now, -1, 0));
  bssl::UniquePtr<ASN1_TIME> asn1_after(ASN1_TIME_adj(NULL, now, 1, 0));

  ASSERT_EQ(-1, X509_cmp_time(asn1_before.get(), NULL));
  ASSERT_EQ(1, X509_cmp_time(asn1_after.get(), NULL));
}